

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::update_params(raft_server *this,raft_params *new_params)

{
  bool bVar1;
  srv_role sVar2;
  reference ppVar3;
  element_type *this_00;
  element_type *peVar4;
  ptr<raft_params> *in_RDI;
  lock_guard<std::mutex> guard_1;
  peer *p;
  pair<const_int,_std::shared_ptr<nuraft::peer>_> *entry;
  iterator __end1;
  iterator __begin1;
  unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
  *__range1;
  ptr<raft_params> clone;
  unique_lock<std::recursive_mutex> guard;
  raft_server *in_stack_00000150;
  peer *in_stack_ffffffffffffff78;
  unique_lock<std::recursive_mutex> *in_stack_ffffffffffffff80;
  context *in_stack_ffffffffffffff90;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_58;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_50;
  ptr<raft_params> *local_48;
  
  std::unique_lock<std::recursive_mutex>::unique_lock
            (in_stack_ffffffffffffff80,(mutex_type *)in_stack_ffffffffffffff78);
  cs_new<nuraft::raft_params,nuraft::raft_params_const&>((raft_params *)in_stack_ffffffffffffff78);
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x273b64);
  nuraft::context::set_params(in_stack_ffffffffffffff90,in_RDI);
  apply_and_log_current_params(in_stack_00000150);
  update_rand_timeout((raft_server *)
                      __end1.
                      super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                      ._M_cur);
  sVar2 = std::atomic::operator_cast_to_srv_role((atomic<nuraft::srv_role> *)0x273b9c);
  if (sVar2 != leader) {
    restart_election_timer((raft_server *)__range1);
  }
  local_48 = in_RDI + 0x1e;
  local_50._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
       ::begin((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                *)in_stack_ffffffffffffff78);
  local_58._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
       ::end((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
              *)in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_50,&local_58);
    if (!bVar1) break;
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
             operator*((_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                        *)0x273c25);
    this_00 = std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::get
                        (&(ppVar3->second).
                          super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>);
    in_stack_ffffffffffffff80 = (unique_lock<std::recursive_mutex> *)peer::get_lock(this_00);
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_ffffffffffffff80,
               (mutex_type *)in_stack_ffffffffffffff78);
    peVar4 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x273c72);
    peer::set_hb_interval(this_00,*(int32 *)(peVar4 + 8));
    peer::resume_hb_speed((peer *)0x273c8a);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x273c96);
    std::__detail::
    _Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::operator++
              ((_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false> *
               )in_stack_ffffffffffffff80);
    in_stack_ffffffffffffff78 = this_00;
  }
  std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x273cc9);
  std::unique_lock<std::recursive_mutex>::~unique_lock(in_stack_ffffffffffffff80);
  return;
}

Assistant:

void raft_server::update_params(const raft_params& new_params) {
    recur_lock(lock_);

    ptr<raft_params> clone = cs_new<raft_params>(new_params);
    ctx_->set_params(clone);
    apply_and_log_current_params();

    update_rand_timeout();
    if (role_ != srv_role::leader) {
        restart_election_timer();
    }
    for (auto& entry: peers_) {
        peer* p = entry.second.get();
        auto_lock(p->get_lock());
        p->set_hb_interval(clone->heart_beat_interval_);
        p->resume_hb_speed();
    }
}